

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamIteratorInterface<IntraPredFunc<void_(*)(unsigned_char_*,_long,_const_unsigned_char_*,_const_unsigned_char_*)>_>
* __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<IntraPredFunc<void_(*)(unsigned_char_*,_long,_const_unsigned_char_*,_const_unsigned_char_*)>_>
::Iterator::Clone(Iterator *this)

{
  Iterator *this_00;
  Iterator *in_RDI;
  
  this_00 = (Iterator *)operator_new(0x20);
  Iterator(this_00,in_RDI);
  return &this_00->
          super_ParamIteratorInterface<IntraPredFunc<void_(*)(unsigned_char_*,_long,_const_unsigned_char_*,_const_unsigned_char_*)>_>
  ;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }